

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

greatest_test_res gzip_fextra(void)

{
  int iVar1;
  uint local_14;
  int res;
  uint dlen;
  uchar out [1];
  
  res._3_1_ = -1;
  local_14 = 1;
  iVar1 = tinf_gzip_uncompress((void *)((long)&res + 3),&local_14,gzip_fextra::data,0x1e);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (((iVar1 == 0) && (local_14 == 1)) && (res._3_1_ == '\0')) {
    greatest_info.msg = (char *)0x0;
    dlen = 0;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    greatest_info.fail_line = 0x321;
    greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    dlen = 0xffffffff;
  }
  return dlen;
}

Assistant:

TEST gzip_fextra(void)
{
	/* One byte 00, uncompressed, fextra */
	static const unsigned char data[] = {
		0x1F, 0x8B, 0x08, 0x04, 0x00, 0x00, 0x00, 0x00, 0x02, 0x0B,
		0x04, 0x00, 0x64, 0x61, 0x74, 0x61, 0x01, 0x01, 0x00, 0xFE,
		0xFF, 0x00, 0x8D, 0xEF, 0x02, 0xD2, 0x01, 0x00, 0x00, 0x00
	};
	unsigned char out[] = { 0xFF };
	unsigned int dlen = 1;
	int res;

	res = tinf_gzip_uncompress(out, &dlen, data, ARRAY_SIZE(data));

	ASSERT(res == TINF_OK && dlen == 1 && out[0] == 0);

	PASS();
}